

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::FCDUTF16CollationIterator::handleNextCE32
          (FCDUTF16CollationIterator *this,UChar32 *c,UErrorCode *errorCode)

{
  UChar **ppUVar1;
  UChar UVar2;
  UTrie2 *pUVar3;
  UBool UVar4;
  uint32_t uVar5;
  UChar *pUVar6;
  uint uVar7;
  
  while (this->checkDir < '\x01') {
    if ((this->checkDir == '\0') &&
       (pUVar6 = (this->super_UTF16CollationIterator).pos,
       pUVar6 != (this->super_UTF16CollationIterator).limit)) goto LAB_0022850c;
    switchToForward(this);
  }
  pUVar6 = (this->super_UTF16CollationIterator).pos;
  if (pUVar6 == (this->super_UTF16CollationIterator).limit) {
LAB_0022853f:
    *c = -1;
    uVar5 = 0xc0;
  }
  else {
    (this->super_UTF16CollationIterator).pos = pUVar6 + 1;
    UVar2 = *pUVar6;
    *c = (uint)(ushort)UVar2;
    UVar4 = CollationFCD::hasTccc((uint)(ushort)UVar2);
    uVar7 = *c;
    if (UVar4 != '\0') {
      if ((uVar7 & 0x1fff01) == 0xf01) {
LAB_002284ee:
        ppUVar1 = &(this->super_UTF16CollationIterator).pos;
        *ppUVar1 = *ppUVar1 + -1;
        UVar4 = nextSegment(this,errorCode);
        if (UVar4 == '\0') goto LAB_0022853f;
        pUVar6 = (this->super_UTF16CollationIterator).pos;
LAB_0022850c:
        (this->super_UTF16CollationIterator).pos = pUVar6 + 1;
        uVar7 = (uint)(ushort)*pUVar6;
        *c = uVar7;
      }
      else {
        pUVar6 = (this->super_UTF16CollationIterator).pos;
        if (pUVar6 != (this->super_UTF16CollationIterator).limit) {
          UVar4 = CollationFCD::hasLccc((uint)(ushort)*pUVar6);
          if (UVar4 != '\0') goto LAB_002284ee;
          uVar7 = *c;
        }
      }
    }
    pUVar3 = (this->super_UTF16CollationIterator).super_CollationIterator.trie;
    uVar5 = pUVar3->data32[(uVar7 & 0x1f) + (uint)pUVar3->index[(int)uVar7 >> 5] * 4];
  }
  return uVar5;
}

Assistant:

uint32_t
FCDUTF16CollationIterator::handleNextCE32(UChar32 &c, UErrorCode &errorCode) {
    for(;;) {
        if(checkDir > 0) {
            if(pos == limit) {
                c = U_SENTINEL;
                return Collation::FALLBACK_CE32;
            }
            c = *pos++;
            if(CollationFCD::hasTccc(c)) {
                if(CollationFCD::maybeTibetanCompositeVowel(c) ||
                        (pos != limit && CollationFCD::hasLccc(*pos))) {
                    --pos;
                    if(!nextSegment(errorCode)) {
                        c = U_SENTINEL;
                        return Collation::FALLBACK_CE32;
                    }
                    c = *pos++;
                }
            }
            break;
        } else if(checkDir == 0 && pos != limit) {
            c = *pos++;
            break;
        } else {
            switchToForward();
        }
    }
    return UTRIE2_GET32_FROM_U16_SINGLE_LEAD(trie, c);
}